

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::benchmarkStarting(XmlReporter *this,BenchmarkInfo *info)

{
  XmlFormatting fmt;
  XmlWriter *pXVar1;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  BenchmarkInfo *local_18;
  BenchmarkInfo *info_local;
  XmlReporter *this_local;
  
  local_18 = info;
  info_local = (BenchmarkInfo *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"samples",&local_39);
  pXVar1 = XmlWriter::writeAttribute<int>(&this->m_xml,&local_38,&local_18->samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"resamples",&local_71);
  pXVar1 = XmlWriter::writeAttribute<unsigned_int>(pXVar1,&local_70,&local_18->resamples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"iterations",&local_99);
  pXVar1 = XmlWriter::writeAttribute<int>(pXVar1,&local_98,&local_18->iterations);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"clockResolution",&local_c1);
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_c0,&local_18->clockResolution);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"estimatedDuration",&local_e9);
  pXVar1 = XmlWriter::writeAttribute<double>(pXVar1,&local_e8,&local_18->estimatedDuration);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,"All values in nano seconds",&local_111);
  fmt = operator|(Newline,Indent);
  XmlWriter::writeComment(pXVar1,&local_110,fmt);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void XmlReporter::benchmarkStarting(BenchmarkInfo const &info) {
        m_xml.writeAttribute("samples", info.samples)
            .writeAttribute("resamples", info.resamples)
            .writeAttribute("iterations", info.iterations)
            .writeAttribute("clockResolution", info.clockResolution)
            .writeAttribute("estimatedDuration", info.estimatedDuration)
            .writeComment("All values in nano seconds");
    }